

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_gname(archive_entry *entry)

{
  wchar_t wVar1;
  char *in_RAX;
  int *piVar2;
  char *p;
  
  p = in_RAX;
  wVar1 = archive_mstring_get_mbs(entry->archive,&entry->ae_gname,&p);
  if (wVar1 != L'\0') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
    p = (char *)0x0;
  }
  return p;
}

Assistant:

const char *
archive_entry_gname(struct archive_entry *entry)
{
	const char *p;
	if (archive_mstring_get_mbs(entry->archive, &entry->ae_gname, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}